

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanAnalyzerResults.cpp
# Opt level: O0

void __thiscall
CanAnalyzerResults::DisplayStringFromData
          (CanAnalyzerResults *this,U64 frame,DisplayBase display_base,char *output,
          U32 result_string_max_length)

{
  char *__dest;
  ostream *poVar1;
  char *__src;
  string local_2b8 [32];
  char local_298 [8];
  char tmp [128];
  U32 numChars;
  allocator local_201;
  string local_200 [32];
  stringstream local_1e0 [8];
  stringstream ss;
  ostream local_1d0 [376];
  ulong local_58;
  U64 CANID;
  U64 APIIndex;
  U64 APIClass;
  U64 Manufacturer;
  U64 DeviceType;
  char *pcStack_28;
  U32 result_string_max_length_local;
  char *output_local;
  U64 UStack_18;
  DisplayBase display_base_local;
  U64 frame_local;
  CanAnalyzerResults *this_local;
  
  Manufacturer = (frame & 0x1f000000) >> 0x18;
  APIClass = (frame & 0xff0000) >> 0x10;
  APIIndex = (frame & 0xfc00) >> 10;
  CANID = (frame & 0x3c0) >> 6;
  local_58 = frame & 0x3f;
  DeviceType._4_4_ = result_string_max_length;
  pcStack_28 = output;
  output_local._4_4_ = display_base;
  UStack_18 = frame;
  frame_local = (U64)this;
  std::__cxx11::stringstream::stringstream(local_1e0);
  if (0x20 < Manufacturer) {
    Manufacturer = 0x20;
  }
  if (9 < APIClass) {
    APIClass = 9;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"",&local_201);
  std::__cxx11::stringstream::str((string *)local_1e0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  poVar1 = std::operator<<(local_1d0,"Dev: ");
  poVar1 = std::operator<<(poVar1,DeviceTypeLookup[Manufacturer]);
  poVar1 = std::operator<<(poVar1," M: ");
  std::operator<<(poVar1,ManufacturerLookup[APIClass]);
  tmp[0x78] = -0x80;
  tmp[0x79] = '\0';
  tmp[0x7a] = '\0';
  tmp[0x7b] = '\0';
  AnalyzerHelpers::GetNumberString(APIIndex,output_local._4_4_,6,local_298,0x80);
  poVar1 = std::operator<<(local_1d0," Class: ");
  std::operator<<(poVar1,local_298);
  AnalyzerHelpers::GetNumberString(CANID,output_local._4_4_,4,local_298,tmp._120_4_);
  poVar1 = std::operator<<(local_1d0," Idx: ");
  std::operator<<(poVar1,local_298);
  AnalyzerHelpers::GetNumberString(local_58,output_local._4_4_,6,local_298,tmp._120_4_);
  poVar1 = std::operator<<(local_1d0," ID: ");
  std::operator<<(poVar1,local_298);
  __dest = pcStack_28;
  std::__cxx11::stringstream::str();
  __src = (char *)std::__cxx11::string::c_str();
  strncpy(__dest,__src,(ulong)(DeviceType._4_4_ - 1));
  std::__cxx11::string::~string(local_2b8);
  pcStack_28[DeviceType._4_4_ - 1] = '\0';
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return;
}

Assistant:

void CanAnalyzerResults::DisplayStringFromData(U64 frame, DisplayBase display_base, char* output, U32 result_string_max_length)
{
    U64 DeviceType = (frame & DEVICE_TYPE_MASK) >> DEVICE_TYPE_SHIFT;
    U64 Manufacturer = (frame & MANUFACTURER_MASK) >> MANUFACTURER_SHIFT;
    U64 APIClass = (frame & API_CLASS_MASK) >> API_CLASS_SHIFT;
    U64 APIIndex = (frame & API_INDEX_MASK) >> API_INDEX_SHIFT;
    U64 CANID = (frame & CANID_MASK) >> CANID_SHIFT;

    std::stringstream ss;

    if (DeviceType > NUM_DEVICE_TYPE)
        DeviceType = NUM_DEVICE_TYPE;
    if (Manufacturer > NUM_MANUFACTURER)
        Manufacturer = NUM_MANUFACTURER;

    ss.str("");
    ss << "Dev: " << DeviceTypeLookup[DeviceType] << " M: " << ManufacturerLookup[Manufacturer];

    U32 numChars = 128;

    char tmp[128];
    AnalyzerHelpers::GetNumberString(APIClass, display_base, API_CLASS_BITS, tmp, numChars);
    ss << " Class: " << tmp;
    AnalyzerHelpers::GetNumberString(APIIndex, display_base, API_INDEX_BITS, tmp, numChars);
    ss << " Idx: " << tmp;
    AnalyzerHelpers::GetNumberString(CANID, display_base, CANID_BITS, tmp, numChars);
    ss << " ID: " << tmp;

    strncpy(output, ss.str().c_str(), result_string_max_length-1);
    output[result_string_max_length - 1] = '\0';
}